

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streamio.c
# Opt level: O3

ctmbstr prvTidyGetEncodingOptNameFromTidyId(uint id)

{
  long lVar1;
  
  lVar1 = 0x10;
  do {
    if (*(uint *)((long)customTagsPicks[0xf].inputs + lVar1 + 0x40) == id) {
      return *(ctmbstr *)((long)&enc2iana[0].id + lVar1);
    }
    lVar1 = lVar1 + 0x18;
  } while (lVar1 != 0x160);
  return (ctmbstr)0x0;
}

Assistant:

ctmbstr TY_(GetEncodingOptNameFromTidyId)(uint id)
{
    uint i;

    for (i = 0; i < sizeof(enc2iana)/sizeof(enc2iana[0]); ++i)
        if (enc2iana[i].id == id)
            return enc2iana[i].tidyOptName;

    return NULL;
}